

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O2

void __thiscall Screen_Manager::Remove(Screen_Manager *this,Am_Drawonable *draw)

{
  Screen_Info **ppSVar1;
  Screen_Info *pSVar2;
  Screen_Info *screen;
  
  pSVar2 = this->head;
  screen = pSVar2;
  if (pSVar2 != (Screen_Info *)0x0) {
    do {
      if (screen->draw == draw) {
        Remove(this,screen);
        return;
      }
      ppSVar1 = &screen->next;
      screen = *ppSVar1;
    } while (*ppSVar1 != pSVar2);
  }
  return;
}

Assistant:

void
Screen_Manager::Remove(Am_Drawonable *draw)
{
  if (!head)
    return;

  Screen_Info *curr = head;
  do {
    if (draw == curr->draw) {
      Remove(curr);
      return;
    }
    curr = curr->next;
  } while (curr != head);
}